

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O0

void round_and_transpose_avx2(__m128i *in,__m128i *out,int bit,int *lr_flip)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  uint uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int *in_RCX;
  char in_DL;
  undefined8 *in_RSI;
  long in_RDI;
  __m256i reg_11;
  __m256i reg_10;
  __m256i reg_01;
  __m256i reg_00;
  __m256i unpckhi01;
  __m256i unpcklo01;
  __m256i unpckhi00;
  __m256i unpcklo00;
  __m256i unpckhi1;
  __m256i unpcklo1;
  __m256i unpckhi0;
  __m256i unpcklo0;
  int step;
  int j;
  __m256i scale;
  __m256i buf_temp [4];
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  uVar15 = 1 << (in_DL + 0xfU & 0x1f);
  auVar5 = vpinsrw_avx(ZEXT216((ushort)uVar15),uVar15 & 0xffff,1);
  auVar5 = vpinsrw_avx(auVar5,uVar15 & 0xffff,2);
  auVar5 = vpinsrw_avx(auVar5,uVar15 & 0xffff,3);
  auVar5 = vpinsrw_avx(auVar5,uVar15 & 0xffff,4);
  auVar5 = vpinsrw_avx(auVar5,uVar15 & 0xffff,5);
  auVar5 = vpinsrw_avx(auVar5,uVar15 & 0xffff,6);
  auVar5 = vpinsrw_avx(auVar5,uVar15 & 0xffff,7);
  auVar6 = vpinsrw_avx(ZEXT216((ushort)uVar15),uVar15 & 0xffff,1);
  auVar6 = vpinsrw_avx(auVar6,uVar15 & 0xffff,2);
  auVar6 = vpinsrw_avx(auVar6,uVar15 & 0xffff,3);
  auVar6 = vpinsrw_avx(auVar6,uVar15 & 0xffff,4);
  auVar6 = vpinsrw_avx(auVar6,uVar15 & 0xffff,5);
  auVar6 = vpinsrw_avx(auVar6,uVar15 & 0xffff,6);
  auVar6 = vpinsrw_avx(auVar6,uVar15 & 0xffff,7);
  uStack_70 = auVar6._0_8_;
  uStack_68 = auVar6._8_8_;
  iVar16 = 7;
  if (*in_RCX == 0) {
    iVar16 = 0;
  }
  uVar15 = -(uint)(*in_RCX != 0) | 1;
  puVar1 = (undefined8 *)(in_RDI + (long)(int)(iVar16 + uVar15 * 4) * 0x10);
  iVar17 = iVar16 + uVar15;
  puVar2 = (undefined8 *)(in_RDI + (long)(int)(iVar17 + uVar15 * 4) * 0x10);
  iVar18 = iVar17 + uVar15;
  puVar3 = (undefined8 *)(in_RDI + (long)(int)(iVar18 + uVar15 * 4) * 0x10);
  puVar4 = (undefined8 *)(in_RDI + (long)(int)(iVar18 + uVar15 + uVar15 * 4) * 0x10);
  auVar14._16_8_ = *puVar1;
  auVar14._0_16_ = *(undefined1 (*) [16])(in_RDI + (long)iVar16 * 0x10);
  auVar14._24_8_ = puVar1[1];
  auVar7._16_8_ = uStack_70;
  auVar7._0_16_ = auVar5;
  auVar7._24_8_ = uStack_68;
  auVar7 = vpmulhrsw_avx2(auVar14,auVar7);
  auVar13._16_8_ = *puVar2;
  auVar13._0_16_ = *(undefined1 (*) [16])(in_RDI + (long)iVar17 * 0x10);
  auVar13._24_8_ = puVar2[1];
  auVar8._16_8_ = uStack_70;
  auVar8._0_16_ = auVar5;
  auVar8._24_8_ = uStack_68;
  auVar8 = vpmulhrsw_avx2(auVar13,auVar8);
  auVar12._16_8_ = *puVar3;
  auVar12._0_16_ = *(undefined1 (*) [16])(in_RDI + (long)iVar18 * 0x10);
  auVar12._24_8_ = puVar3[1];
  auVar9._16_8_ = uStack_70;
  auVar9._0_16_ = auVar5;
  auVar9._24_8_ = uStack_68;
  auVar9 = vpmulhrsw_avx2(auVar12,auVar9);
  auVar11._16_8_ = *puVar4;
  auVar11._0_16_ = *(undefined1 (*) [16])(in_RDI + (long)(int)(iVar18 + uVar15) * 0x10);
  auVar11._24_8_ = puVar4[1];
  auVar10._16_8_ = uStack_70;
  auVar10._0_16_ = auVar5;
  auVar10._24_8_ = uStack_68;
  auVar10 = vpmulhrsw_avx2(auVar11,auVar10);
  auVar11 = vpunpcklwd_avx2(auVar7,auVar8);
  auVar7 = vpunpckhwd_avx2(auVar7,auVar8);
  auVar12 = vpunpcklwd_avx2(auVar9,auVar10);
  auVar8 = vpunpckhwd_avx2(auVar9,auVar10);
  auVar10 = vpunpckldq_avx2(auVar11,auVar12);
  auVar9 = vpunpckhdq_avx2(auVar11,auVar12);
  auVar11 = vpunpckldq_avx2(auVar7,auVar8);
  auVar7 = vpunpckhdq_avx2(auVar7,auVar8);
  auVar8 = vpermq_avx2(auVar10,0xd8);
  auVar9 = vpermq_avx2(auVar9,0xd8);
  auVar10 = vpermq_avx2(auVar11,0xd8);
  auVar7 = vpermq_avx2(auVar7,0xd8);
  local_660 = auVar8._0_8_;
  uStack_658 = auVar8._8_8_;
  *in_RSI = local_660;
  in_RSI[1] = uStack_658;
  uStack_648 = auVar8._24_8_;
  uStack_650 = auVar8._16_8_;
  in_RSI[4] = uStack_650;
  in_RSI[5] = uStack_648;
  local_680 = auVar9._0_8_;
  uStack_678 = auVar9._8_8_;
  in_RSI[4] = local_680;
  in_RSI[5] = uStack_678;
  uStack_668 = auVar9._24_8_;
  uStack_670 = auVar9._16_8_;
  in_RSI[8] = uStack_670;
  in_RSI[9] = uStack_668;
  local_6a0 = auVar10._0_8_;
  uStack_698 = auVar10._8_8_;
  in_RSI[8] = local_6a0;
  in_RSI[9] = uStack_698;
  uStack_688 = auVar10._24_8_;
  uStack_690 = auVar10._16_8_;
  in_RSI[0xc] = uStack_690;
  in_RSI[0xd] = uStack_688;
  local_6c0 = auVar7._0_8_;
  uStack_6b8 = auVar7._8_8_;
  uStack_6b0 = auVar7._16_8_;
  uStack_6a8 = auVar7._24_8_;
  in_RSI[0xc] = local_6c0;
  in_RSI[0xd] = uStack_6b8;
  in_RSI[0xe] = uStack_6b0;
  in_RSI[0xf] = uStack_6a8;
  return;
}

Assistant:

static inline void round_and_transpose_avx2(const __m128i *const in,
                                            __m128i *const out, int bit,
                                            int *lr_flip) {
  __m256i buf_temp[4];
  const __m256i scale = _mm256_set1_epi16(1 << (15 + bit));
  int j = *lr_flip ? 7 : 0;
  const int step = *lr_flip ? -1 : 1;

  // 70 71 72 73 74 75 76 77 | 30 31 32 33 34 35 36 37
  buf_temp[0] = _mm256_inserti128_si256(_mm256_castsi128_si256(in[j]),
                                        in[j + 4 * step], 1);
  j += step;
  // 60 61 62 63 64 65 66 67 | 20 21 22 23 24 25 26 27
  buf_temp[1] = _mm256_inserti128_si256(_mm256_castsi128_si256(in[j]),
                                        in[j + 4 * step], 1);
  j += step;
  // 50 51 52 53 54 55 56 57 | 10 11 12 13 14 15 16 17
  buf_temp[2] = _mm256_inserti128_si256(_mm256_castsi128_si256(in[j]),
                                        in[j + 4 * step], 1);
  j += step;
  // 40 41 42 43 44 45 46 47 | 00 01 02 03 04 05 06 07
  buf_temp[3] = _mm256_inserti128_si256(_mm256_castsi128_si256(in[j]),
                                        in[j + 4 * step], 1);

  // 70 71 72 73 74 75 76 77 | 30 31 32 33 34 35 36 37
  buf_temp[0] = _mm256_mulhrs_epi16(buf_temp[0], scale);
  // 60 61 62 63 64 65 66 67 | 20 21 22 23 24 25 26 27
  buf_temp[1] = _mm256_mulhrs_epi16(buf_temp[1], scale);
  // 50 51 52 53 54 55 56 57 | 10 11 12 13 14 15 16 17
  buf_temp[2] = _mm256_mulhrs_epi16(buf_temp[2], scale);
  // 40 41 42 43 44 45 46 47 | 00 01 02 03 04 05 06 07
  buf_temp[3] = _mm256_mulhrs_epi16(buf_temp[3], scale);

  // 70 60 71 61 72 62 73 63 | 30 20 31 21 32 22 33 23
  const __m256i unpcklo0 = _mm256_unpacklo_epi16(buf_temp[0], buf_temp[1]);
  // 74 64 75 65 76 66 77 67 | 34 24 35 25 36 26 37 27
  const __m256i unpckhi0 = _mm256_unpackhi_epi16(buf_temp[0], buf_temp[1]);
  // 50 40 51 41 52 42 53 43 | 10 00 11 01 12 02 13 03
  const __m256i unpcklo1 = _mm256_unpacklo_epi16(buf_temp[2], buf_temp[3]);
  // 54 44 55 45 56 46 57 47 | 14 04 15 05 16 06 17 07
  const __m256i unpckhi1 = _mm256_unpackhi_epi16(buf_temp[2], buf_temp[3]);

  // 70 60 50 40 71 61 51 41 | 30 20 10 00 31 21 11 01
  const __m256i unpcklo00 = _mm256_unpacklo_epi32(unpcklo0, unpcklo1);
  // 72 62 52 42 73 63 53 43 | 32 22 12 02 33 23 13 03
  const __m256i unpckhi00 = _mm256_unpackhi_epi32(unpcklo0, unpcklo1);
  // 74 64 54 44 75 65 55 45 | 34 24 14 04 35 25 15 05
  const __m256i unpcklo01 = _mm256_unpacklo_epi32(unpckhi0, unpckhi1);
  // 76 66 56 46 77 67 57 47 | 36 26 16 06 37 27 17 07
  const __m256i unpckhi01 = _mm256_unpackhi_epi32(unpckhi0, unpckhi1);

  // 70 60 50 40 30 20 10 00 | 71 61 51 41 31 21 11 01
  const __m256i reg_00 = _mm256_permute4x64_epi64(unpcklo00, 0xd8);
  // 72 62 52 42 32 22 12 02 | 73 63 53 43 33 23 13 03
  const __m256i reg_01 = _mm256_permute4x64_epi64(unpckhi00, 0xd8);
  // 74 64 54 44 34 24 14 04 | 75 65 55 45 35 25 15 05
  const __m256i reg_10 = _mm256_permute4x64_epi64(unpcklo01, 0xd8);
  // 76 66 56 46 36 26 16 06 | 77 67 57 47 37 27 17 07
  const __m256i reg_11 = _mm256_permute4x64_epi64(unpckhi01, 0xd8);

  // 70 60 50 40 30 20 10 00
  out[0] = _mm256_castsi256_si128(reg_00);
  // 71 61 51 41 31 21 11 01
  out[1] = _mm256_extracti128_si256(reg_00, 1);
  // 72 62 52 42 32 22 12 02
  out[2] = _mm256_castsi256_si128(reg_01);
  // 73 63 53 43 33 23 13 03
  out[3] = _mm256_extracti128_si256(reg_01, 1);
  // 74 64 54 44 34 24 14 04
  out[4] = _mm256_castsi256_si128(reg_10);
  // 75 65 55 45 35 25 15 05
  out[5] = _mm256_extracti128_si256(reg_10, 1);
  // 76 66 56 46 36 26 16 06
  out[6] = _mm256_castsi256_si128(reg_11);
  // 77 67 57 47 37 27 17 07
  out[7] = _mm256_extracti128_si256(reg_11, 1);
}